

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::EbmlElementSize(uint64 type,char *value)

{
  uint uVar1;
  uint uVar2;
  size_t value_00;
  
  if (value != (char *)0x0) {
    uVar1 = GetUIntSize(type);
    value_00 = strlen(value);
    uVar2 = GetCodedUIntSize(value_00);
    return (ulong)uVar2 + uVar1 + value_00;
  }
  return 0;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const char* value) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += strlen(value);

  // Size of Datasize
  ebml_size += GetCodedUIntSize(strlen(value));

  return ebml_size;
}